

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_do_button(nk_flags *state,nk_command_buffer *out,nk_rect r,nk_style_button *style,
                nk_input *in,nk_button_behavior behavior,nk_rect *content)

{
  float fVar1;
  float fVar2;
  nk_rect r_00;
  nk_rect bounds;
  nk_rect *content_local;
  nk_button_behavior behavior_local;
  nk_input *in_local;
  nk_style_button *style_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  float fStack_18;
  nk_rect r_local;
  
  if (style == (nk_style_button *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4c72,
                  "int nk_do_button(nk_flags *, struct nk_command_buffer *, struct nk_rect, const struct nk_style_button *, const struct nk_input *, enum nk_button_behavior, struct nk_rect *)"
                 );
  }
  if (state != (nk_flags *)0x0) {
    if (out != (nk_command_buffer *)0x0) {
      if ((out == (nk_command_buffer *)0x0) || (style == (nk_style_button *)0x0)) {
        r_local.w = 0.0;
      }
      else {
        state_local._4_4_ = r.x;
        content->x = state_local._4_4_ + (style->padding).x + style->border + style->rounding;
        fStack_18 = r.y;
        content->y = fStack_18 + (style->padding).y + style->border + style->rounding;
        r_local.x = r.w;
        fVar1 = (style->padding).x;
        content->w = r_local.x - (style->rounding + style->rounding + fVar1 + fVar1 + style->border)
        ;
        r_local.y = r.h;
        fVar1 = (style->padding).y;
        content->h = r_local.y - (style->rounding + style->rounding + fVar1 + fVar1 + style->border)
        ;
        fVar1 = (style->touch_padding).x;
        fVar2 = (style->touch_padding).y;
        r_00.y = fStack_18 - (style->touch_padding).y;
        r_00.x = state_local._4_4_ - (style->touch_padding).x;
        r_00.w = fVar1 + fVar1 + r_local.x;
        r_00.h = fVar2 + fVar2 + r_local.y;
        r_local.w = (float)nk_button_behavior(state,r_00,in,behavior);
      }
      return (int)r_local.w;
    }
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4c74,
                  "int nk_do_button(nk_flags *, struct nk_command_buffer *, struct nk_rect, const struct nk_style_button *, const struct nk_input *, enum nk_button_behavior, struct nk_rect *)"
                 );
  }
  __assert_fail("state",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x4c73,
                "int nk_do_button(nk_flags *, struct nk_command_buffer *, struct nk_rect, const struct nk_style_button *, const struct nk_input *, enum nk_button_behavior, struct nk_rect *)"
               );
}

Assistant:

NK_LIB int
nk_do_button(nk_flags *state, struct nk_command_buffer *out, struct nk_rect r,
    const struct nk_style_button *style, const struct nk_input *in,
    enum nk_button_behavior behavior, struct nk_rect *content)
{
    struct nk_rect bounds;
    NK_ASSERT(style);
    NK_ASSERT(state);
    NK_ASSERT(out);
    if (!out || !style)
        return nk_false;

    /* calculate button content space */
    content->x = r.x + style->padding.x + style->border + style->rounding;
    content->y = r.y + style->padding.y + style->border + style->rounding;
    content->w = r.w - (2 * style->padding.x + style->border + style->rounding*2);
    content->h = r.h - (2 * style->padding.y + style->border + style->rounding*2);

    /* execute button behavior */
    bounds.x = r.x - style->touch_padding.x;
    bounds.y = r.y - style->touch_padding.y;
    bounds.w = r.w + 2 * style->touch_padding.x;
    bounds.h = r.h + 2 * style->touch_padding.y;
    return nk_button_behavior(state, bounds, in, behavior);
}